

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_count.cpp
# Opt level: O2

void __thiscall BamTools::CountTool::CountTool(CountTool *this)

{
  CountSettings *pCVar1;
  OptionGroup *group;
  string *defaultValue;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__CountTool_001f1e20;
  pCVar1 = (CountSettings *)operator_new(0x60);
  CountSettings::CountSettings(pCVar1);
  this->m_settings = pCVar1;
  this->m_impl = (CountToolPrivate *)0x0;
  std::__cxx11::string::string((string *)&local_98,"bamtools count",(allocator *)&local_38);
  std::__cxx11::string::string
            ((string *)&local_78,"prints number of alignments in BAM file(s)",&local_9b);
  std::__cxx11::string::string
            ((string *)&local_58,
             "[-in <filename> -in <filename> ... | -list <filelist>] [-region <REGION>]",&local_9c);
  Options::SetProgramInfo(&local_98,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"Input & Output",(allocator *)&local_78);
  group = Options::CreateOptionGroup(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-in",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"BAM filename",&local_9c);
  std::__cxx11::string::string((string *)&local_58,"the input BAM file(s)",&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  pCVar1 = this->m_settings;
  defaultValue = Options::StandardIn_abi_cxx11_();
  Options::
  AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const>
            (&local_98,&local_78,&local_58,&local_38,&pCVar1->HasInput,&pCVar1->InputFiles,group,
             defaultValue);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-list",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"filename",&local_9c);
  std::__cxx11::string::string
            ((string *)&local_58,"the input BAM file list, one line per file",&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  Options::AddValueOption<std::__cxx11::string>
            (&local_98,&local_78,&local_58,&local_38,&this->m_settings->HasInputFilelist,
             &this->m_settings->InputFilelist,group);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-region",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"REGION",&local_9c);
  std::__cxx11::string::string
            ((string *)&local_58,
             "genomic region. Index file is recommended for better performance, and is used automatically if it exists. See \'bamtools help index\' for more details on creating one"
             ,&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  Options::AddValueOption<std::__cxx11::string>
            (&local_98,&local_78,&local_58,&local_38,&this->m_settings->HasRegion,
             &this->m_settings->Region,group);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

CountTool::CountTool()
    : AbstractTool()
    , m_settings(new CountSettings)
    , m_impl(0)
{
    // set program details
    Options::SetProgramInfo(
        "bamtools count", "prints number of alignments in BAM file(s)",
        "[-in <filename> -in <filename> ... | -list <filelist>] [-region <REGION>]");

    // set up options
    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");
    Options::AddValueOption("-in", "BAM filename", "the input BAM file(s)", "",
                            m_settings->HasInput, m_settings->InputFiles, IO_Opts,
                            Options::StandardIn());
    Options::AddValueOption("-list", "filename", "the input BAM file list, one line per file", "",
                            m_settings->HasInputFilelist, m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-region", "REGION",
                            "genomic region. Index file is recommended for better performance, and "
                            "is used automatically if it exists. See \'bamtools help index\' for "
                            "more details on creating one",
                            "", m_settings->HasRegion, m_settings->Region, IO_Opts);
}